

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(long lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  long ret;
  short local_2e;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  long local_28 [2];
  
  result_00 = &local_2c;
  local_2c.m_int = 0;
  local_28[0] = lhs;
  bVar1 = DivisionCornerCaseHelper2<short,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase2(lhs,rhs,result_00);
  if (!bVar1) {
    local_28[1] = 0;
    local_2e = rhs.m_int;
    DivisionHelper<long,_short,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (local_28,&local_2e,local_28 + 1);
    result_00 = &local_2a;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>
              (result_00,local_28 + 1);
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}